

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::RandSeqProductionSymbol::serializeTo
          (RandSeqProductionSymbol *this,ASTSerializer *serializer)

{
  pointer ppPVar1;
  pointer ppFVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Type *__n;
  pointer pRVar5;
  pointer pRVar6;
  pointer ppPVar7;
  char *pcVar8;
  size_t sVar9;
  RepeatProd *rp;
  pointer ppEVar10;
  ProdItem *item_00;
  CaseItem *item;
  long lVar11;
  pointer ppEVar12;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> sVar13;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view propName;
  string_view name_02;
  string_view name_03;
  string_view propName_00;
  string_view propName_01;
  string_view propName_02;
  anon_class_8_1_79d3bf50 writeItem;
  
  writeItem.serializer = serializer;
  __n = DeclaredType::getType(&this->declaredReturnType);
  ASTSerializer::write(serializer,10,"returnType",(size_t)__n);
  name._M_str = "arguments";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  ppFVar2 = (this->arguments)._M_ptr;
  sVar9 = (this->arguments)._M_extent._M_extent_value;
  for (lVar11 = 0; sVar9 << 3 != lVar11; lVar11 = lVar11 + 8) {
    ASTSerializer::serialize(serializer,*(Symbol **)((long)ppFVar2 + lVar11),false);
  }
  ASTSerializer::endArray(serializer);
  name_00._M_str = "rules";
  name_00._M_len = 5;
  ASTSerializer::startArray(serializer,name_00);
  sVar13 = getRules(this);
  pRVar5 = sVar13._M_ptr;
  pRVar6 = pRVar5 + sVar13._M_extent._M_extent_value._M_extent_value;
  do {
    if (pRVar5 == pRVar6) {
      ASTSerializer::endArray(serializer);
      return;
    }
    ASTSerializer::startObject(serializer);
    name_01._M_str = "prods";
    name_01._M_len = 5;
    ASTSerializer::startArray(serializer,name_01);
    ppPVar7 = (pRVar5->prods)._M_ptr;
    ppPVar1 = ppPVar7 + (pRVar5->prods)._M_extent._M_extent_value;
    for (; ppPVar7 != ppPVar1; ppPVar7 = ppPVar7 + 1) {
      item_00 = (ProdItem *)*ppPVar7;
      ASTSerializer::startObject(serializer);
      switch((item_00->super_ProdBase).kind) {
      case Item:
        ASTSerializer::write(serializer,4,"kind",4);
        goto LAB_0022b3c1;
      case CodeBlock:
        ASTSerializer::write(serializer,4,"kind",9);
        break;
      case IfElse:
        ASTSerializer::write(serializer,4,"kind",6);
        ASTSerializer::write(serializer,4,"expr",(size_t)item_00->target);
        propName_01._M_str = "ifItem";
        propName_01._M_len = 6;
        serializeTo::anon_class_8_1_79d3bf50::operator()
                  (&writeItem,propName_01,(ProdItem *)&item_00->args);
        if (*(char *)&item_00[2].args._M_ptr != '\x01') break;
        item_00 = (ProdItem *)&item_00[1].args;
        sVar9 = 8;
        pcVar8 = "elseItem";
        goto LAB_0022b3ce;
      case Repeat:
        ASTSerializer::write(serializer,4,"kind",6);
        ASTSerializer::write(serializer,4,"expr",(size_t)item_00->target);
        item_00 = (ProdItem *)&item_00->args;
LAB_0022b3c1:
        sVar9 = 4;
        pcVar8 = "item";
LAB_0022b3ce:
        propName_02._M_str = pcVar8;
        propName_02._M_len = sVar9;
        serializeTo::anon_class_8_1_79d3bf50::operator()(&writeItem,propName_02,item_00);
        break;
      case Case:
        ASTSerializer::write(serializer,4,"kind",4);
        ASTSerializer::write(serializer,4,"expr",(size_t)item_00->target);
        if ((char)item_00[2].super_ProdBase.kind == CodeBlock) {
          propName._M_str = "defaultItem";
          propName._M_len = 0xb;
          serializeTo::anon_class_8_1_79d3bf50::operator()(&writeItem,propName,item_00 + 1);
        }
        name_02._M_str = "items";
        name_02._M_len = 5;
        ASTSerializer::startArray(serializer,name_02);
        ppEVar12 = (item_00->args)._M_ptr;
        ppEVar10 = ppEVar12 + (item_00->args)._M_extent._M_extent_value * 6;
        for (; ppEVar12 != ppEVar10; ppEVar12 = ppEVar12 + 6) {
          ASTSerializer::startObject(serializer);
          name_03._M_str = "expressions";
          name_03._M_len = 0xb;
          ASTSerializer::startArray(serializer,name_03);
          pEVar3 = *ppEVar12;
          pEVar4 = ppEVar12[1];
          for (lVar11 = 0; (long)pEVar4 << 3 != lVar11; lVar11 = lVar11 + 8) {
            ASTSerializer::serialize(serializer,*(Expression **)((long)&pEVar3->kind + lVar11));
          }
          ASTSerializer::endArray(serializer);
          propName_00._M_str = "item";
          propName_00._M_len = 4;
          serializeTo::anon_class_8_1_79d3bf50::operator()
                    (&writeItem,propName_00,(ProdItem *)(ppEVar12 + 2));
          ASTSerializer::endObject(serializer);
        }
        ASTSerializer::endArray(serializer);
      }
      ASTSerializer::endObject(serializer);
    }
    ASTSerializer::endArray(serializer);
    if (pRVar5->weightExpr != (Expression *)0x0) {
      ASTSerializer::write(serializer,10,"weightExpr",(size_t)pRVar5->weightExpr);
    }
    ASTSerializer::write(serializer,10,"isRandJoin",(ulong)pRVar5->isRandJoin);
    if (pRVar5->randJoinExpr != (Expression *)0x0) {
      ASTSerializer::write(serializer,0xc,"randJoinExpr",(size_t)pRVar5->randJoinExpr);
    }
    ASTSerializer::endObject(serializer);
    pRVar5 = pRVar5 + 1;
  } while( true );
}

Assistant:

void RandSeqProductionSymbol::serializeTo(ASTSerializer& serializer) const {
    auto writeItem = [&](std::string_view propName, const ProdItem& item) {
        serializer.writeProperty(propName);
        serializer.startObject();
        if (item.target)
            serializer.writeLink("target", *item.target);

        serializer.startArray("args");
        for (auto arg : item.args)
            serializer.serialize(*arg);
        serializer.endArray();

        serializer.endObject();
    };

    serializer.write("returnType", getReturnType());

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    serializer.startArray("rules");
    for (auto& rule : getRules()) {
        serializer.startObject();

        serializer.startArray("prods");
        for (auto prod : rule.prods) {
            serializer.startObject();
            switch (prod->kind) {
                case ProdKind::Item:
                    serializer.write("kind", "Item"sv);
                    writeItem("item", *(const ProdItem*)prod);
                    break;
                case ProdKind::CodeBlock:
                    serializer.write("kind", "CodeBlock"sv);
                    break;
                case ProdKind::IfElse: {
                    auto& iep = *(const IfElseProd*)prod;
                    serializer.write("kind", "IfElse"sv);
                    serializer.write("expr", *iep.expr);

                    writeItem("ifItem", iep.ifItem);
                    if (iep.elseItem)
                        writeItem("elseItem", *iep.elseItem);
                    break;
                }
                case ProdKind::Repeat: {
                    auto& rp = *(const RepeatProd*)prod;
                    serializer.write("kind", "Repeat"sv);
                    serializer.write("expr", *rp.expr);
                    writeItem("item", rp.item);
                    break;
                }
                case ProdKind::Case: {
                    auto& cp = *(const CaseProd*)prod;
                    serializer.write("kind", "Case"sv);
                    serializer.write("expr", *cp.expr);
                    if (cp.defaultItem)
                        writeItem("defaultItem", *cp.defaultItem);

                    serializer.startArray("items");
                    for (auto& item : cp.items) {
                        serializer.startObject();
                        serializer.startArray("expressions");
                        for (auto expr : item.expressions)
                            serializer.serialize(*expr);
                        serializer.endArray();

                        writeItem("item", item.item);
                        serializer.endObject();
                    }
                    serializer.endArray();
                    break;
                }
            }
            serializer.endObject();
        }
        serializer.endArray();

        if (rule.weightExpr)
            serializer.write("weightExpr", *rule.weightExpr);

        serializer.write("isRandJoin", rule.isRandJoin);
        if (rule.randJoinExpr)
            serializer.write("randJoinExpr", *rule.randJoinExpr);

        serializer.endObject();
    }
    serializer.endArray();
}